

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlCtxtGetStatus(xmlParserCtxt *ctxt)

{
  uint uVar1;
  int iVar2;
  uint local_1c;
  int bits;
  xmlParserCtxt *ctxt_local;
  
  iVar2 = xmlCtxtIsCatastrophicError(ctxt);
  if (iVar2 == 0) {
    local_1c = (uint)(ctxt->wellFormed == 0);
    if (ctxt->nsWellFormed == 0) {
      local_1c = local_1c | 2;
    }
    if ((ctxt->validate != 0) && (ctxt->valid == 0)) {
      local_1c = local_1c | 4;
    }
    ctxt_local._4_4_ = local_1c;
  }
  else {
    local_1c = 0xb;
    uVar1 = 0xb;
    if ((ctxt != (xmlParserCtxt *)0x0) && (uVar1 = local_1c, ctxt->validate != 0)) {
      uVar1 = 0xf;
    }
    local_1c = uVar1;
    ctxt_local._4_4_ = local_1c;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlCtxtGetStatus(xmlParserCtxt *ctxt) {
    int bits = 0;

    if (xmlCtxtIsCatastrophicError(ctxt)) {
        bits |= XML_STATUS_CATASTROPHIC_ERROR |
                XML_STATUS_NOT_WELL_FORMED |
                XML_STATUS_NOT_NS_WELL_FORMED;
        if ((ctxt != NULL) && (ctxt->validate))
            bits |= XML_STATUS_DTD_VALIDATION_FAILED;

        return(bits);
    }

    if (!ctxt->wellFormed)
        bits |= XML_STATUS_NOT_WELL_FORMED;
    if (!ctxt->nsWellFormed)
        bits |= XML_STATUS_NOT_NS_WELL_FORMED;
    if ((ctxt->validate) && (!ctxt->valid))
        bits |= XML_STATUS_DTD_VALIDATION_FAILED;

    return(bits);
}